

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin1.c
# Opt level: O0

Vec_Vec_t *
Saig_ManCexMinCollectReason
          (Aig_Man_t *pAig,Abc_Cex_t *pCex,Vec_Vec_t *vFrameCis,Vec_Vec_t *vFramePPs,int fPiReason)

{
  int iVar1;
  Vec_Vec_t *p;
  Vec_Int_t *p_00;
  Aig_Obj_t *pObj_00;
  Vec_Int_t *vReason;
  Vec_Int_t *local_60;
  int local_58;
  int local_54;
  int f;
  int i;
  Aig_Obj_t *pObj;
  Vec_Int_t *vLeaves;
  Vec_Int_t *vRoots;
  Vec_Vec_t *vFrameReas;
  int fPiReason_local;
  Vec_Vec_t *vFramePPs_local;
  Vec_Vec_t *vFrameCis_local;
  Abc_Cex_t *pCex_local;
  Aig_Man_t *pAig_local;
  
  p = Vec_VecStart(pCex->iFrame + 1);
  p_00 = Vec_IntAlloc(1000);
  for (local_58 = pCex->iFrame; -1 < local_58; local_58 = local_58 + -1) {
    Saig_ManCexMinDerivePhasePriority(pAig,pCex,vFrameCis,vFramePPs,local_58,p_00);
    if (local_58 == pCex->iFrame) {
      local_60 = (Vec_Int_t *)0x0;
    }
    else {
      local_60 = Vec_VecEntryInt(vFrameCis,local_58 + 1);
    }
    Saig_ManCexMinGetCos(pAig,pCex,local_60,p_00);
    Aig_ManIncrementTravId(pAig);
    for (local_54 = 0; iVar1 = Vec_IntSize(p_00), local_54 < iVar1; local_54 = local_54 + 1) {
      iVar1 = Vec_IntEntry(p_00,local_54);
      pObj_00 = Aig_ManObj(pAig,iVar1);
      vReason = Vec_VecEntryInt(p,local_58);
      Saig_ManCexMinCollectReason_rec(pAig,pObj_00,vReason,fPiReason);
    }
  }
  Vec_IntFree(p_00);
  return p;
}

Assistant:

Vec_Vec_t * Saig_ManCexMinCollectReason( Aig_Man_t * pAig, Abc_Cex_t * pCex, Vec_Vec_t * vFrameCis, Vec_Vec_t * vFramePPs, int fPiReason )
{
    Vec_Vec_t * vFrameReas;
    Vec_Int_t * vRoots, * vLeaves;
    Aig_Obj_t * pObj;
    int i, f;
    // select reason for the property to fail
    vFrameReas = Vec_VecStart( pCex->iFrame+1 );
    vRoots = Vec_IntAlloc( 1000 );
    for ( f = pCex->iFrame; f >= 0; f-- )
    {
        // set phase and polarity
        Saig_ManCexMinDerivePhasePriority( pAig, pCex, vFrameCis, vFramePPs, f, vRoots );
        // create roots
        vLeaves = (f == pCex->iFrame) ? NULL : Vec_VecEntryInt(vFrameCis, f+1);
        Saig_ManCexMinGetCos( pAig, pCex, vLeaves, vRoots );
        // collect nodes starting from the roots
        Aig_ManIncrementTravId( pAig );
        Aig_ManForEachObjVec( vRoots, pAig, pObj, i )
            Saig_ManCexMinCollectReason_rec( pAig, pObj, Vec_VecEntryInt(vFrameReas, f), fPiReason );
//printf( "%d(%d) ", Vec_VecLevelSize(vFrameCis, f), Vec_VecLevelSize(vFrameReas, f) ); 
    }
//printf( "\n" );
    Vec_IntFree( vRoots );
    return vFrameReas;
}